

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O1

void __thiscall
Clasp::DefaultUnfoundedCheck::updateSource(DefaultUnfoundedCheck *this,AtomData *atom,BodyPtr *n)

{
  uint uVar1;
  pointer pBVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)*atom & 0x1fffffff;
  if (uVar3 != 0x1fffffff) {
    pBVar2 = (this->bodies_).ebo_.buf;
    uVar1 = *(uint *)(pBVar2 + uVar3);
    *(uint *)(pBVar2 + uVar3) = uVar1 & 0x80000000 | uVar1 - 1 & 0x7fffffff;
  }
  *atom = (AtomData)((uint)*atom & 0x60000000 | n->id & 0x1fffffff | 0x80000000);
  pBVar2 = (this->bodies_).ebo_.buf;
  uVar1 = *(uint *)(pBVar2 + n->id);
  *(uint *)(pBVar2 + n->id) = uVar1 & 0x80000000 | uVar1 + 1 & 0x7fffffff;
  return;
}

Assistant:

void DefaultUnfoundedCheck::updateSource(AtomData& atom, const BodyPtr& n) {
	if (atom.watch() != AtomData::nill_source) {
		--bodies_[atom.watch()].watches;
	}
	atom.setSource(n.id);
	++bodies_[n.id].watches;
}